

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O2

bool __thiscall Trie::insert(Trie *this,Unicode *_unicode)

{
  NodeMap *this_00;
  uint32_t uVar1;
  pointer puVar2;
  iterator iVar3;
  mapped_type ptVar4;
  _Rb_tree_header *p_Var5;
  mapped_type *pptVar6;
  pointer puVar7;
  uint16_t index;
  Trie *local_38;
  
  ptVar4 = this->root;
  local_38 = this;
  for (puVar7 = (_unicode->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                _M_impl.super__Vector_impl_data._M_start;
      puVar2 = (_unicode->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
               _M_impl.super__Vector_impl_data._M_finish, puVar7 != puVar2; puVar7 = puVar7 + 1) {
    index = *puVar7;
    this_00 = &ptVar4->nextMap;
    iVar3 = std::
            _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_trie_node_s_*>,_std::_Select1st<std::pair<const_unsigned_short,_trie_node_s_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
            ::find(&this_00->_M_t,&index);
    if ((_Rb_tree_header *)iVar3._M_node == &(ptVar4->nextMap)._M_t._M_impl.super__Rb_tree_header) {
      ptVar4 = (mapped_type)operator_new(0x40);
      (ptVar4->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (ptVar4->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      p_Var5 = &(ptVar4->nextMap)._M_t._M_impl.super__Rb_tree_header;
      (ptVar4->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
      (ptVar4->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
      (ptVar4->nextMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      ptVar4->search_clue = (trie_node_t *)0x0;
      ptVar4->infoIndex = -1;
      pptVar6 = std::
                map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
                ::operator[](this_00,&index);
      *pptVar6 = ptVar4;
    }
    pptVar6 = std::
              map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
              ::operator[](this_00,&index);
    ptVar4 = *pptVar6;
  }
  uVar1 = local_38->size;
  local_38->size = uVar1 + 1;
  ptVar4->infoIndex = uVar1;
  return puVar7 == puVar2;
}

Assistant:

bool Trie::insert(Unicode &_unicode)
{
	trie_node_t *node = root;
	uint16_t index;
	auto iter = _unicode.begin();
	for ( ; iter != _unicode.end(); iter++ ) {
		index = *iter;
		if ( node->nextMap.find(index) == node->nextMap.end() ) {
			try {
				node->nextMap[index] = new trie_node_t;
			}
		    catch(const bad_alloc& ) {
				return false;
			}
		}
		node = node->nextMap[index];
	}
	node->infoIndex = size++;
	return true;
}